

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

void __thiscall tvm::runtime::TVMRetValue::Clear(TVMRetValue *this)

{
  Object *this_00;
  _Function_base *this_01;
  
  switch((this->super_TVMPODValue_).type_code_) {
  case 4:
    goto switchD_0011aa38_caseD_4;
  default:
    goto switchD_0011aa38_caseD_5;
  case 8:
  case 9:
    this_00 = (Object *)(this->super_TVMPODValue_).value_.v_handle;
    break;
  case 10:
    this_01 = (_Function_base *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_01 != (_Function_base *)0x0) {
      std::_Function_base::~_Function_base(this_01);
    }
    goto LAB_0011aa6f;
  case 0xb:
  case 0xc:
    this_01 = (_Function_base *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_01 != (_Function_base *)0x0) {
      std::__cxx11::string::~string((string *)this_01);
    }
LAB_0011aa6f:
    operator_delete(this_01);
    goto switchD_0011aa38_caseD_5;
  case 0xd:
    this_00 = (Object *)((this->super_TVMPODValue_).value_.v_int64 + -0x10);
  }
  Object::DecRef(this_00);
switchD_0011aa38_caseD_5:
  (this->super_TVMPODValue_).type_code_ = 4;
switchD_0011aa38_caseD_4:
  return;
}

Assistant:

void Clear() {
    if (type_code_ == kTVMNullptr) return;
    switch (type_code_) {
      case kTVMStr: case kTVMBytes: delete ptr<std::string>(); break;
      case kTVMPackedFuncHandle: delete ptr<PackedFunc>(); break;
      case kTVMNDArrayHandle: {
        NDArray::FFIDecRef(static_cast<TVMArrayHandle>(value_.v_handle));
        break;
      }
      case kTVMModuleHandle: {
        static_cast<Object*>(value_.v_handle)->DecRef();
        break;
      }
      case kTVMObjectHandle: {
        static_cast<Object*>(value_.v_handle)->DecRef();
        break;
      }
    }
    type_code_ = kTVMNullptr;
  }